

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O3

Literal * Kernel::FracLess<Kernel::RealConstantType>::normalizedLit
                    (bool polarity,TermList lhs,TermList rhs)

{
  TermList TVar1;
  uint uVar2;
  int iVar3;
  Term *pTVar4;
  Literal *pLVar5;
  size_type in_RCX;
  size_type in_R8;
  initializer_list<Kernel::TermList> args;
  initializer_list<Kernel::TermList> args_00;
  initializer_list<Kernel::TermList> args_01;
  uint64_t local_38;
  Term *local_30;
  
  if (normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero == '\0') {
    iVar3 = __cxa_guard_acquire(&normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero);
    if (iVar3 != 0) {
      normalizedLit::zero._content = (uint64_t)NumTraits<Kernel::RealConstantType>::zeroT();
      __cxa_guard_release(&normalizedLit(bool,Kernel::TermList,Kernel::TermList)::zero);
    }
  }
  TVar1._content = normalizedLit::zero._content;
  uVar2 = NumTraits<Kernel::RealConstantType>::minusF();
  args._M_len = in_RCX;
  args._M_array = (iterator)0x1;
  local_38 = lhs._content;
  pTVar4 = Term::create((Term *)(ulong)uVar2,(uint)&local_38,args);
  uVar2 = NumTraits<Kernel::RealConstantType>::addF();
  args_00._M_len = in_RCX;
  args_00._M_array = (iterator)0x2;
  local_38 = rhs._content;
  local_30 = pTVar4;
  pTVar4 = Term::create((Term *)(ulong)uVar2,(uint)&local_38,args_00);
  uVar2 = NumTraits<Kernel::RealConstantType>::lessF();
  local_38 = TVar1._content;
  args_01._M_len = in_R8;
  args_01._M_array = (iterator)0x2;
  local_30 = pTVar4;
  pLVar5 = Literal::create((Literal *)(ulong)uVar2,(uint)polarity,SUB81(&local_38,0),args_01);
  return pLVar5;
}

Assistant:

static Literal* normalizedLit(bool polarity, TermList lhs, TermList rhs) {
    static auto zero = TermList(number::zeroT());
    return number::less(
              polarity,
              zero,
              number::add(rhs, number::minus(lhs)));
  }